

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

cJSON * detach_item_from_array(cJSON *array,size_t which)

{
  cJSON *local_28;
  cJSON *c;
  size_t which_local;
  cJSON *array_local;
  
  c = (cJSON *)which;
  for (local_28 = array->child; local_28 != (cJSON *)0x0 && c != (cJSON *)0x0;
      local_28 = local_28->next) {
    c = (cJSON *)((long)&c[-1].string + 7);
  }
  if (local_28 == (cJSON *)0x0) {
    array_local = (cJSON *)0x0;
  }
  else {
    if (local_28 != array->child) {
      local_28->prev->next = local_28->next;
    }
    if (local_28->next != (cJSON *)0x0) {
      local_28->next->prev = local_28->prev;
    }
    if (local_28 == array->child) {
      array->child = local_28->next;
    }
    else if (local_28->next == (cJSON *)0x0) {
      array->child->prev = local_28->prev;
    }
    local_28->next = (cJSON *)0x0;
    local_28->prev = (cJSON *)0x0;
    array_local = local_28;
  }
  return array_local;
}

Assistant:

static cJSON *detach_item_from_array(cJSON *array, size_t which)
{
    cJSON *c = array->child;
    while (c && (which > 0))
    {
        c = c->next;
        which--;
    }
    if (!c)
    {
        /* item doesn't exist */
        return NULL;
    }
    if (c != array->child)
    {
        /* not the first element */
        c->prev->next = c->next;
    }
    if (c->next)
    {
        c->next->prev = c->prev;
    }
    if (c == array->child)
    {
        array->child = c->next;
    }
    else if (c->next == NULL)
    {
        array->child->prev = c->prev;
    }
    /* make sure the detached item doesn't point anywhere anymore */
    c->prev = c->next = NULL;

    return c;
}